

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O1

void newsym(int x,int y)

{
  rm *prVar1;
  monst *pmVar2;
  level *plVar3;
  boolean bVar4;
  int iVar5;
  region *prVar6;
  obj *poVar7;
  trap *ptVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  xchar y_00;
  monst *pmVar13;
  xchar x_00;
  bool bVar14;
  bool bVar15;
  
  plVar3 = level;
  if (in_mklev != '\0') {
    return;
  }
  if ((u._1052_1_ & 1) != 0) {
    if (u.ux != x) {
      return;
    }
    if (u.uy != y) {
      return;
    }
    goto LAB_0016a885;
  }
  if (((u._1052_1_ & 2) != 0) &&
     (bVar4 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar4 == '\0')) {
    bVar4 = is_pool(level,x,y);
    if (bVar4 == '\0') {
      return;
    }
    uVar10 = x - u.ux;
    uVar12 = -uVar10;
    if (0 < (int)uVar10) {
      uVar12 = uVar10;
    }
    uVar11 = y - u.uy;
    uVar10 = -uVar11;
    if (0 < (int)uVar11) {
      uVar10 = uVar11;
    }
    if (1 < uVar12) {
      return;
    }
    if (1 < uVar10) {
      return;
    }
  }
  prVar1 = plVar3->locations[x] + y;
  y_00 = (xchar)y;
  x_00 = (xchar)x;
  if ((viz_array[y][x] & 2U) != 0) {
    prVar6 = visible_region_at(level,x_00,y_00);
    *(uint *)&prVar1->field_0x6 =
         (*(uint *)&prVar1->field_0x6 & 0xfffff7ff) + (*(uint *)&prVar1->field_0x6 & 0x400) * 2;
    if ((u.ux != x) || (u.uy != y)) {
      pmVar2 = level->monsters[x][y];
      pmVar13 = (monst *)0x0;
      if ((pmVar2 != (monst *)0x0) && ((pmVar2->field_0x61 & 2) == 0)) {
        pmVar13 = pmVar2;
      }
      if (pmVar13 == (monst *)0x0) {
        bVar9 = false;
      }
      else {
        bVar9 = true;
        if (pmVar13->mx == x) {
          bVar9 = pmVar13->my != y;
        }
      }
      if (pmVar13 == (monst *)0x0) {
        bVar14 = false;
      }
      else {
        uVar12 = *(uint *)&pmVar13->field_0x60;
        if (bVar9) {
          bVar14 = true;
          if (((uVar12 & 2) != 0) && (u.uprops[0xc].extrinsic == 0 && u.uprops[0xc].intrinsic == 0))
          {
            bVar14 = (bool)(*(byte *)((long)&(youmonst.data)->mflags1 + 3) & 1);
          }
        }
        else {
          if ((((uVar12 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) {
            if ((uVar12 & 0x280) == 0) goto LAB_0016adee;
          }
          else if (((uVar12 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_0016adee:
            bVar14 = true;
            if ((u._1052_1_ & 0x20) == 0) goto LAB_0016b228;
          }
          if (((pmVar13->data->mflags1 & 0x10000) == 0) &&
             ((poVar7 = which_armor(pmVar13,4), poVar7 == (obj *)0x0 ||
              (poVar7 = which_armor(pmVar13,4), poVar7->otyp != 0x4f)))) {
            if (((u.uprops[0x1e].intrinsic != 0) ||
                (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
                 (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
               (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
                ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                  (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                  youmonst.data == mons + 0x32 && (bVar14 = true, u.uprops[0x19].blocked == 0))))))
            goto LAB_0016b228;
            if ((u.uprops[0x19].extrinsic != 0) && (u.uprops[0x19].blocked == 0)) {
              iVar5 = dist2((int)pmVar13->mx,(int)pmVar13->my,(int)u.ux,(int)u.uy);
              bVar14 = true;
              if (iVar5 < 0x41) goto LAB_0016b228;
            }
          }
          bVar4 = match_warn_of_mon(pmVar13);
          bVar14 = bVar4 != '\0';
        }
      }
LAB_0016b228:
      if (pmVar13 != (monst *)0x0) {
        if ((bVar14 != false) ||
           ((bVar9 == false && (u.uprops[0x42].extrinsic != 0 || u.uprops[0x42].intrinsic != 0)))) {
          if ((pmVar13->field_0x62 & 0x80) != 0) {
            ptVar8 = t_at(level,x,y);
            if (ptVar8 == (trap *)0x0) {
              uVar12 = 0;
            }
            else {
              uVar12 = (byte)ptVar8->field_0x8 & 0x1f;
            }
            if ((uVar12 < 0x14) && ((0x81820U >> uVar12 & 1) != 0)) {
              ptVar8->field_0x8 = ptVar8->field_0x8 | 0x20;
            }
          }
          map_location(x,y,0);
          display_monster(x_00,y_00,pmVar13,2 - (uint)bVar14,bVar9);
          goto LAB_0016b358;
        }
        if ((((u.uprops[0x18].extrinsic != 0 || u.uprops[0x18].intrinsic != 0) &&
             ((pmVar13->field_0x62 & 0x40) == 0)) &&
            (iVar5 = dist2((int)pmVar13->mx,(int)pmVar13->my,(int)u.ux,(int)u.uy), iVar5 < 100)) &&
           ((pmVar13->mx == x && (pmVar13->my == y)))) {
          display_warning(pmVar13);
          goto LAB_0016b358;
        }
      }
      if ((level->locations[x][y].field_0x6 & 8) == 0) {
        map_location(x,y,1);
      }
      else {
        map_invisible(x_00,y_00);
      }
      goto LAB_0016b358;
    }
    if (((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
         && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
        ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) && ((u._1052_1_ & 1) == 0)) {
      if (((((youmonst.data == mons + 0x7b || youmonst.data == mons + 0x9e) ||
             (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0)) &&
           (u.uprops[0xd].blocked == 0)) && (u.uprops[0xc].intrinsic == 0)) &&
         (u.uprops[0xc].extrinsic == 0)) {
        if (((u._1052_1_ & 4) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0)) {
LAB_0016b0f4:
          if ((u.uprops[0x19].extrinsic == 0 || u.uprops[0x19].blocked != 0) &&
             ((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)))) {
            map_location(x,y,1);
            goto LAB_0016b358;
          }
        }
      }
      else if ((u._1052_1_ & 4) != 0) goto LAB_0016b0f4;
    }
    map_location(x,y,0);
    display_self();
LAB_0016b358:
    if (prVar6 == (region *)0x0) {
      return;
    }
    if (prVar1->typ < '\x17') {
      return;
    }
    if (0x14 < (uint)y || 0x4e < x - 1U) {
      return;
    }
    dbuf[(uint)y][(uint)x].effect = prVar6->effect_id;
    return;
  }
  if ((u.ux == x) && (u.uy == y)) {
    feel_location(u.ux,u.uy);
    if ((((u.uprops[0x1e].intrinsic == 0) &&
         (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
          (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
        ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) && ((u._1052_1_ & 1) == 0)) {
      if ((((youmonst.data == mons + 0x7b || youmonst.data == mons + 0x9e) ||
            (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0)) &&
          (u.uprops[0xd].blocked == 0)) &&
         ((u.uprops[0xc].intrinsic == 0 && (u.uprops[0xc].extrinsic == 0)))) {
        if (((u._1052_1_ & 4) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
        goto LAB_0016a885;
      }
      else if ((u._1052_1_ & 4) == 0) goto LAB_0016a885;
      if ((u.uprops[0x19].extrinsic == 0 || u.uprops[0x19].blocked != 0) &&
         ((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)))) {
        return;
      }
    }
LAB_0016a885:
    display_self();
    return;
  }
  pmVar2 = level->monsters[x][y];
  pmVar13 = (monst *)0x0;
  if ((pmVar2 != (monst *)0x0) && ((pmVar2->field_0x61 & 2) == 0)) {
    pmVar13 = pmVar2;
  }
  if (pmVar13 != (monst *)0x0) {
    if (((pmVar13->data->mflags1 & 0x10000) == 0) &&
       ((poVar7 = which_armor(pmVar13,4), poVar7 == (obj *)0x0 ||
        (poVar7 = which_armor(pmVar13,4), poVar7->otyp != 0x4f)))) {
      if (((u.uprops[0x1e].intrinsic == 0) &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
          ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
            (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
            youmonst.data != mons + 0x32 || (bVar9 = true, u.uprops[0x19].blocked != 0)))))) {
        if ((u.uprops[0x19].extrinsic != 0) && (u.uprops[0x19].blocked == 0)) {
          iVar5 = dist2((int)pmVar13->mx,(int)pmVar13->my,(int)u.ux,(int)u.uy);
          bVar9 = true;
          if (iVar5 < 0x41) goto LAB_0016af89;
        }
        goto LAB_0016ad9b;
      }
    }
    else {
LAB_0016ad9b:
      bVar4 = match_warn_of_mon(pmVar13);
      bVar9 = true;
      if (bVar4 == '\0') {
        if (((((u.uprops[0x1e].intrinsic == 0) &&
              (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
               (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
             ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
            ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
             (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
           (((pmVar13->data->mflags3 & 0x200) != 0 &&
            ((viz_array[pmVar13->my][pmVar13->mx] & 1U) != 0)))) {
          uVar12 = *(uint *)&pmVar13->field_0x60;
          if (((uVar12 & 2) == 0) ||
             ((u.uprops[0xc].intrinsic != 0 || (u.uprops[0xc].extrinsic != 0)))) {
            if ((char)uVar12 < '\0') goto LAB_0016af73;
          }
          else if (((char)uVar12 < '\0') || (((youmonst.data)->mflags1 & 0x1000000) == 0))
          goto LAB_0016af73;
          bVar14 = (uVar12 >> 9 & 1) == 0;
          bVar15 = (u._1052_1_ & 0x20) == 0;
          bVar9 = bVar15 && bVar14;
          if (bVar15 && bVar14) goto LAB_0016af89;
        }
        else {
LAB_0016af73:
          bVar9 = false;
        }
        if ((u.uprops[0x42].intrinsic == 0) && (u.uprops[0x42].extrinsic == 0)) goto LAB_0016afc5;
      }
    }
LAB_0016af89:
    if ((pmVar13->mx == x) && (pmVar13->my == y)) {
      display_monster(x_00,y_00,pmVar13,(uint)!bVar9 * 2,'\0');
      return;
    }
  }
LAB_0016afc5:
  pmVar2 = level->monsters[x][y];
  pmVar13 = (monst *)0x0;
  if ((pmVar2 != (monst *)0x0) && ((pmVar2->field_0x61 & 2) == 0)) {
    pmVar13 = pmVar2;
  }
  if (((((pmVar13 != (monst *)0x0) &&
        (u.uprops[0x18].extrinsic != 0 || u.uprops[0x18].intrinsic != 0)) &&
       ((pmVar13->field_0x62 & 0x40) == 0)) &&
      ((iVar5 = dist2((int)pmVar13->mx,(int)pmVar13->my,(int)u.ux,(int)u.uy), iVar5 < 100 &&
       (pmVar13->mx == x)))) && (pmVar13->my == y)) {
    display_warning(pmVar13);
    return;
  }
  if ((*(uint *)&prVar1->field_0x6 >> 0xb & 1) == 0) {
    uVar12 = *(uint *)prVar1;
    if ((uVar12 & 0x3f) == 0xf) {
      if (prVar1->typ == '\x19') {
        uVar12 = uVar12 & 0xffffffc0 | 0x10;
        goto LAB_0016b08a;
      }
    }
    else if (((uVar12 & 0x3f) == 0xe) && (prVar1->typ == '\x18')) {
      uVar12 = uVar12 & 0xffffffc0 | 0xd;
LAB_0016b08a:
      *(uint *)prVar1 = uVar12;
      *(uint *)&prVar1->field_0x6 = *(uint *)&prVar1->field_0x6 & 0xfffff7fc;
      dbuf_set_loc(x,y);
      return;
    }
  }
  dbuf_set(level,x,y,(rm *)0x0,-1,-1,-1,-1,-1,-1,-1,0,0,0);
  return;
}

Assistant:

void newsym(int x, int y)
{
    struct monst *mon;
    struct rm *loc = &(level->locations[x][y]);
    int see_it;
    xchar worm_tail;

    if (in_mklev) return;

    /* only permit updating the hero when swallowed */
    if (u.uswallow) {
	if (x == u.ux && y == u.uy) display_self();
	return;
    }
    if (Underwater && !Is_waterlevel(&u.uz)) {
	/* don't do anything unless (x,y) is an adjacent underwater position */
	int dx, dy;
	if (!is_pool(level, x,y)) return;
	dx = x - u.ux;	if (dx < 0) dx = -dx;
	dy = y - u.uy;	if (dy < 0) dy = -dy;
	if (dx > 1 || dy > 1) return;
    }

    /* Can physically see the location. */
    if (cansee(x,y)) {
        struct region* reg = visible_region_at(level, x, y);
	/*
	 * Don't use templit here:  E.g.
	 *
	 *	loc->waslit = !!(loc->lit || templit(x,y));
	 *
	 * Otherwise we have the "light pool" problem, where non-permanently
	 * lit areas just out of sight stay remembered as lit.  They should
	 * re-darken.
	 *
	 * Perhaps ALL areas should revert to their "unlit" look when
	 * out of sight.
	 */
	loc->waslit = (loc->lit!=0);	/* remember lit condition */

	if (x == u.ux && y == u.uy) {
	    if (senseself()) {
		map_location(x,y,0);	/* map *under* self */
		display_self();
	    } else
		/* we can see what is there */
		map_location(x,y,1);
	}
	else {
	    mon = m_at(level, x,y);
	    worm_tail = is_worm_tail(mon);
	    see_it = mon && (worm_tail
		? (!mon->minvis || See_invisible)
		: (mon_visible(mon)) || tp_sensemon(mon) || match_warn_of_mon(mon));
	    if (mon && (see_it || (!worm_tail && Detect_monsters))) {
		if (mon->mtrapped) {
		    struct trap *trap = t_at(level, x, y);
		    int tt = trap ? trap->ttyp : NO_TRAP;

		    /* if monster is in a physical trap, you see the trap too */
		    if (tt == BEAR_TRAP || tt == PIT ||
			tt == SPIKED_PIT ||tt == WEB) {
			trap->tseen = TRUE;
		    }
		}
		map_location(x,y,0);	/* map under the monster */
		/* also gets rid of any invisibility glyph */
		display_monster(x, y, mon, see_it ? PHYSICALLY_SEEN : DETECTED, worm_tail);
	    }
	    else if (mon && mon_warning(mon) && !is_worm_tail(mon))
	        display_warning(mon);
	    else if (level->locations[x][y].mem_invis)
		map_invisible(x, y);
	    else
		map_location(x,y,1);	/* map the location */
	}
	
	if (reg != NULL && ACCESSIBLE(loc->typ))
	    dbuf_set_effect(x, y, reg->effect_id);
    }

    /* Can't see the location. */
    else {
	if (x == u.ux && y == u.uy) {
	    feel_location(u.ux, u.uy);		/* forces an update */

	    if (senseself())
		display_self();
	}
	else if ((mon = m_at(level, x,y))
		&& ((see_it = (tp_sensemon(mon) || match_warn_of_mon(mon)
		    		|| (see_with_infrared(mon) && mon_visible(mon))))
		    || Detect_monsters)
		&& !is_worm_tail(mon)) {
	    /* Monsters are printed every time. */
	    /* This also gets rid of any invisibility glyph */
	    display_monster(x, y, mon, see_it ? 0 : DETECTED, 0);
	}
	else if ((mon = m_at(level, x,y)) && mon_warning(mon) &&
		 !is_worm_tail(mon)) {
	        display_warning(mon);
	}		

	/*
	 * If the location is remembered as being both dark (waslit is false)
	 * and lit (glyph is a lit room or lit corridor) then it was either:
	 *
	 *	(1) A dark location that the hero could see through night
	 *	    vision.
	 *
	 *	(2) Darkened while out of the hero's sight.  This can happen
	 *	    when cursed scroll of light is read.
	 *
	 * In either case, we have to manually correct the hero's memory to
	 * match waslit.  Deciding when to change waslit is non-trivial.
	 *
	 *  Note:  If flags.lit_corridor is set, then corridors act like room
	 *	   squares.  That is, they light up if in night vision range.
	 *	   If flags.lit_corridor is not set, then corridors will
	 *	   remain dark unless lit by a light spell and may darken
	 *	   again, as discussed above.
	 *
	 * These checks and changes must be here and not in back_to_glyph().
	 * They are dependent on the position being out of sight.
	 */
	else if (!loc->waslit) {
	    if (loc->mem_bg == S_litcorr && loc->typ == CORR) {
		loc->mem_bg = S_corr;
		loc->mem_door_l = 0;
		loc->mem_door_t = 0;
		dbuf_set_loc(x, y);
	    } else if (loc->mem_bg == S_room && loc->typ == ROOM) {
		loc->mem_bg = S_darkroom;
		loc->mem_door_l = 0;
		loc->mem_door_t = 0;
		dbuf_set_loc(x, y);
	    }
	    else
		goto show_mem;
	} else {
show_mem:
	    dbuf_set_loc(x, y);
	}
    }
}